

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall soul::heart::Printer::PrinterStream::printConnections(PrinterStream *this)

{
  bool bVar1;
  vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
  *this_00;
  reference ppVar2;
  CodePrinter *pCVar3;
  Connection *pCVar4;
  char *s;
  long *plVar5;
  pool_ref<soul::heart::Connection> local_30;
  pool_ref<soul::heart::Connection> c;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
  *__range2;
  PrinterStream *this_local;
  
  this_00 = &this->module->connections;
  __end2 = std::
           vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
           ::begin(this_00);
  c.object = (Connection *)
             std::
             vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
             ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_soul::pool_ref<soul::heart::Connection>_*,_std::vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>_>
                                     *)&c), bVar1) {
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_soul::pool_ref<soul::heart::Connection>_*,_std::vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>_>
             ::operator*(&__end2);
    local_30.object = ppVar2->object;
    pCVar3 = choc::text::CodePrinter::operator<<(this->out,"connection ");
    pCVar4 = pool_ref<soul::heart::Connection>::operator->(&local_30);
    s = getInterpolationDescription(pCVar4->interpolationType);
    pCVar3 = choc::text::CodePrinter::operator<<(pCVar3,s);
    choc::text::CodePrinter::operator<<(pCVar3,' ');
    pCVar4 = pool_ref<soul::heart::Connection>::operator->(&local_30);
    printEndpointReference(this,&pCVar4->source);
    pCVar4 = pool_ref<soul::heart::Connection>::operator->(&local_30);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&pCVar4->delayLength);
    if (bVar1) {
      pCVar3 = choc::text::CodePrinter::operator<<(this->out," -> [");
      pCVar4 = pool_ref<soul::heart::Connection>::operator->(&local_30);
      plVar5 = std::optional<long>::operator*(&pCVar4->delayLength);
      pCVar3 = choc::text::CodePrinter::operator<<(pCVar3,*plVar5);
      choc::text::CodePrinter::operator<<(pCVar3,']');
    }
    choc::text::CodePrinter::operator<<(this->out," -> ");
    pCVar4 = pool_ref<soul::heart::Connection>::operator->(&local_30);
    printEndpointReference(this,&pCVar4->dest);
    pCVar3 = choc::text::CodePrinter::operator<<(this->out,';');
    choc::text::CodePrinter::operator<<(pCVar3,(NewLine *)&newLine);
    pool_ref<soul::heart::Connection>::~pool_ref(&local_30);
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::heart::Connection>_*,_std::vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void printConnections()
        {
            for (auto c : module.connections)
            {
                out << "connection "
                    << getInterpolationDescription (c->interpolationType)
                    << ' ';

                printEndpointReference (c->source);

                if (c->delayLength)
                    out << " -> [" << *c->delayLength << ']';

                out << " -> ";
                printEndpointReference (c->dest);
                out << ';' << newLine;
            }
        }